

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_set_ge(secp256k1_gej *r,secp256k1_ge *a)

{
  secp256k1_gej *in_RSI;
  void *in_RDI;
  int in_stack_ffffffffffffffec;
  
  secp256k1_ge_verify((secp256k1_ge *)in_RSI);
  *(int *)((long)in_RDI + 0x90) = (int)(in_RSI->z).n[0];
  memcpy(in_RDI,in_RSI,0x30);
  memcpy((void *)((long)in_RDI + 0x30),&in_RSI->y,0x30);
  secp256k1_fe_set_int(&in_RSI->x,in_stack_ffffffffffffffec);
  secp256k1_gej_verify(in_RSI);
  return;
}

Assistant:

static void secp256k1_gej_set_ge(secp256k1_gej *r, const secp256k1_ge *a) {
   secp256k1_ge_verify(a);
   r->infinity = a->infinity;
   r->x = a->x;
   r->y = a->y;
   secp256k1_fe_set_int(&r->z, 1);
   secp256k1_gej_verify(r);
}